

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint8_t *aStatus,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> local_80;
  promise<ot::commissioner::Error> local_70;
  promise<ot::commissioner::Error> *local_58;
  uint8_t *puStack_50;
  code *local_48;
  code *pcStack_40;
  
  std::promise<ot::commissioner::Error>::promise(&local_70);
  pcStack_40 = std::
               _Function_handler<void_(const_unsigned_char_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:453:32)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_unsigned_char_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:453:32)>
             ::_M_manager;
  local_58 = &local_70;
  puStack_50 = aStatus;
  (*(this->super_Commissioner)._vptr_Commissioner[0x31])
            (this,&local_58,aMulticastAddrList,(ulong)aTimeout);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&local_80,&local_70._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_80);
  if (local_80._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::RegisterMulticastListener(uint8_t                        &aStatus,
                                                  const std::vector<std::string> &aMulticastAddrList,
                                                  uint32_t                        aTimeout)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aStatus](const uint8_t *status, Error error) {
        if (status != nullptr)
        {
            aStatus = *status;
        }
        pro.set_value(error);
    };

    RegisterMulticastListener(wait, aMulticastAddrList, aTimeout);
    return pro.get_future().get();
}